

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_slbfee_(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 retval;
  TCGv_ptr arg1;
  uint32_t uVar1;
  TCGLabel *l;
  TCGLabel *l_00;
  TCGLabel *l2;
  TCGLabel *l1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    uVar1 = rS(ctx->opcode);
    retval = cpu_gpr[uVar1];
    arg1 = tcg_ctx_00->cpu_env;
    uVar1 = rB(ctx->opcode);
    gen_helper_find_slb_vsid(tcg_ctx_00,retval,arg1,cpu_gpr[uVar1]);
    l = gen_new_label_ppc64(tcg_ctx_00);
    l_00 = gen_new_label_ppc64(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,cpu_crf[0],cpu_so);
    uVar1 = rS(ctx->opcode);
    tcg_gen_brcondi_i64_ppc64(tcg_ctx_00,TCG_COND_EQ,cpu_gpr[uVar1],-1,l);
    tcg_gen_ori_i32_ppc64(tcg_ctx_00,cpu_crf[0],cpu_crf[0],2);
    tcg_gen_br(tcg_ctx_00,l_00);
    gen_set_label(tcg_ctx_00,l);
    uVar1 = rS(ctx->opcode);
    tcg_gen_movi_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],0);
    gen_set_label(tcg_ctx_00,l_00);
  }
  else {
    gen_inval_exception(ctx,2);
  }
  return;
}

Assistant:

static void gen_slbfee_(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l1, *l2;

    if (unlikely(ctx->pr)) {
        gen_inval_exception(ctx, POWERPC_EXCP_PRIV_REG);
        return;
    }
    gen_helper_find_slb_vsid(tcg_ctx, cpu_gpr[rS(ctx->opcode)], tcg_ctx->cpu_env,
                             cpu_gpr[rB(ctx->opcode)]);
    l1 = gen_new_label(tcg_ctx);
    l2 = gen_new_label(tcg_ctx);
    tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[0], cpu_so);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, cpu_gpr[rS(ctx->opcode)], -1, l1);
    tcg_gen_ori_i32(tcg_ctx, cpu_crf[0], cpu_crf[0], CRF_EQ);
    tcg_gen_br(tcg_ctx, l2);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rS(ctx->opcode)], 0);
    gen_set_label(tcg_ctx, l2);
}